

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O2

void CALC_FCSLOT(OPL3_CH *CH,OPL3_SLOT *SLOT)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  UINT32 UVar4;
  uchar uVar5;
  
  SLOT->Incr = (uint)SLOT->mul * CH->fc;
  bVar2 = CH->kcode >> (SLOT->KSR & 0x1f);
  uVar1 = (uint)bVar2;
  if (uVar1 != SLOT->ksr) {
    SLOT->ksr = bVar2;
    uVar3 = SLOT->ar + uVar1;
    if (uVar3 < 0x4c) {
      bVar2 = ""[uVar3];
      UVar4 = ~(-1 << (bVar2 & 0x1f));
      uVar5 = "pppppppppppppppp"[uVar3];
    }
    else {
      uVar5 = 'h';
      bVar2 = 0;
      UVar4 = 0;
    }
    SLOT->eg_sh_ar = bVar2;
    SLOT->eg_m_ar = UVar4;
    SLOT->eg_sel_ar = uVar5;
    uVar3 = SLOT->dr + uVar1;
    bVar2 = ""[uVar3];
    SLOT->eg_sh_dr = bVar2;
    SLOT->eg_m_dr = ~(-1 << (bVar2 & 0x1f));
    SLOT->eg_sel_dr = "pppppppppppppppp"[uVar3];
    uVar1 = uVar1 + SLOT->rr;
    bVar2 = ""[uVar1];
    SLOT->eg_sh_rr = bVar2;
    SLOT->eg_m_rr = ~(-1 << (bVar2 & 0x1f));
    SLOT->eg_sel_rr = "pppppppppppppppp"[uVar1];
  }
  return;
}

Assistant:

INLINE void CALC_FCSLOT(OPL_CH *CH,OPL_SLOT *SLOT)
{
	int ksr;

	/* (frequency) phase increment counter */
	SLOT->Incr = CH->fc * SLOT->mul;
	ksr = CH->kcode >> SLOT->KSR;

	if( SLOT->ksr != ksr )
	{
		SLOT->ksr = ksr;

		/* calculate envelope generator rates */
		if ((SLOT->ar + SLOT->ksr) < 16+62)
		{
			SLOT->eg_sh_ar  = eg_rate_shift [SLOT->ar + SLOT->ksr ];
			SLOT->eg_sel_ar = eg_rate_select[SLOT->ar + SLOT->ksr ];
		}
		else
		{
			SLOT->eg_sh_ar  = 0;
			SLOT->eg_sel_ar = 13*RATE_STEPS;
		}
		SLOT->eg_sh_dr  = eg_rate_shift [SLOT->dr + SLOT->ksr ];
		SLOT->eg_sel_dr = eg_rate_select[SLOT->dr + SLOT->ksr ];
		SLOT->eg_sh_rr  = eg_rate_shift [SLOT->rr + SLOT->ksr ];
		SLOT->eg_sel_rr = eg_rate_select[SLOT->rr + SLOT->ksr ];
	}
}